

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

bool __thiscall cmTarget::HaveBuildTreeRPATH(cmTarget *this,string *config)

{
  bool bVar1;
  LinkImplementationLibraries *pLVar2;
  allocator local_41;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,"SKIP_BUILD_RPATH",&local_41);
  bVar1 = GetPropertyAsBool(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if ((!bVar1) &&
     (pLVar2 = GetLinkImplementationLibraries(this,config),
     pLVar2 != (LinkImplementationLibraries *)0x0)) {
    return (pLVar2->Libraries).super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>.
           _M_impl.super__Vector_impl_data._M_start !=
           (pLVar2->Libraries).super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  }
  return false;
}

Assistant:

bool cmTarget::HaveBuildTreeRPATH(const std::string& config) const
{
  if (this->GetPropertyAsBool("SKIP_BUILD_RPATH"))
    {
    return false;
    }
  if(LinkImplementationLibraries const* impl =
     this->GetLinkImplementationLibraries(config))
    {
    return !impl->Libraries.empty();
    }
  return false;
}